

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O3

Vec_Int_t * Aig_ManPartitionMonolithic(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *__s;
  
  iVar1 = p->vObjs->nSize;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar2 = iVar1;
  }
  pVVar3->nCap = iVar2;
  if (iVar2 == 0) {
    pVVar3->pArray = (int *)0x0;
    pVVar3->nSize = iVar1;
  }
  else {
    __s = (int *)malloc((long)iVar2 << 2);
    pVVar3->pArray = __s;
    pVVar3->nSize = iVar1;
    if (__s != (int *)0x0) {
      memset(__s,0,(long)iVar1 << 2);
    }
  }
  return pVVar3;
}

Assistant:

Vec_Int_t * Aig_ManPartitionMonolithic( Aig_Man_t * p )
{
    Vec_Int_t * vId2Part;
    vId2Part = Vec_IntStart( Aig_ManObjNumMax(p) );
    return vId2Part;
}